

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txreconciliation_tests.cpp
# Opt level: O0

void __thiscall txreconciliation_tests::RegisterPeerTest::test_method(RegisterPeerTest *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  uint64_t salt;
  TxReconciliationTracker tracker;
  char *in_stack_fffffffffffff868;
  lazy_ostream *in_stack_fffffffffffff870;
  char *in_stack_fffffffffffff878;
  NodeId in_stack_fffffffffffff880;
  undefined7 in_stack_fffffffffffff888;
  undefined1 in_stack_fffffffffffff88f;
  lazy_ostream *in_stack_fffffffffffff890;
  undefined7 in_stack_fffffffffffff898;
  undefined1 in_stack_fffffffffffff89f;
  const_string *in_stack_fffffffffffff8a0;
  const_string *file;
  undefined4 in_stack_fffffffffffff8a8;
  ReconciliationRegisterResult in_stack_fffffffffffff8ac;
  const_string local_5c8 [2];
  lazy_ostream local_5a8 [2];
  assertion_result local_588 [2];
  lazy_ostream local_550;
  undefined1 local_538 [64];
  const_string local_4f8 [2];
  lazy_ostream local_4d8 [2];
  assertion_result local_4b8 [2];
  const_string local_480 [2];
  lazy_ostream local_460 [2];
  assertion_result local_440 [2];
  const_string local_408 [2];
  lazy_ostream local_3e8 [2];
  assertion_result local_3c8 [2];
  const_string local_390 [2];
  lazy_ostream local_370 [2];
  assertion_result local_350 [2];
  const_string local_318 [2];
  lazy_ostream local_2f8 [2];
  assertion_result local_2d8 [2];
  const_string local_2a0 [2];
  lazy_ostream local_280 [2];
  assertion_result local_260 [2];
  const_string local_228 [2];
  lazy_ostream local_208 [2];
  assertion_result local_1e8 [2];
  const_string local_1b0 [2];
  lazy_ostream local_190 [2];
  assertion_result local_170 [2];
  lazy_ostream local_138;
  undefined1 local_120 [64];
  const_string local_e0 [2];
  lazy_ostream local_c0 [2];
  assertion_result local_a0 [2];
  lazy_ostream local_68;
  undefined1 local_50 [72];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  TxReconciliationTracker::TxReconciliationTracker
            ((TxReconciliationTracker *)0xb9359e,
             (uint32_t)((ulong)in_stack_fffffffffffff868 >> 0x20));
  TxReconciliationTracker::PreRegisterPeer
            ((TxReconciliationTracker *)in_stack_fffffffffffff878,(NodeId)in_stack_fffffffffffff870)
  ;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
               in_stack_fffffffffffff8a0,
               CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898),
               (const_string *)in_stack_fffffffffffff890);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff870,(char (*) [1])in_stack_fffffffffffff868);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    local_68._vptr_lazy_ostream._4_4_ =
         TxReconciliationTracker::RegisterPeer
                   ((TxReconciliationTracker *)
                    CONCAT17(in_stack_fffffffffffff88f,in_stack_fffffffffffff888),
                    in_stack_fffffffffffff880,SUB81((ulong)in_stack_fffffffffffff878 >> 0x38,0),
                    (uint32_t)in_stack_fffffffffffff878,(uint64_t)in_stack_fffffffffffff870);
    local_68._vptr_lazy_ostream._0_4_ = 3;
    in_stack_fffffffffffff878 = "ReconciliationRegisterResult::PROTOCOL_VIOLATION";
    in_stack_fffffffffffff870 = &local_68;
    in_stack_fffffffffffff868 = "tracker.RegisterPeer( 0, true, 0, salt)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ReconciliationRegisterResult,ReconciliationRegisterResult>
              (local_50,&local_68.m_empty,0x18,1,2,
               (undefined1 *)((long)&local_68._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff868);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
               in_stack_fffffffffffff8a0,
               CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898),
               (const_string *)in_stack_fffffffffffff890);
    TxReconciliationTracker::IsPeerRegistered
              ((TxReconciliationTracker *)in_stack_fffffffffffff878,
               (NodeId)in_stack_fffffffffffff870);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff878,
               SUB81((ulong)in_stack_fffffffffffff870 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff870,(basic_cstring<const_char> *)in_stack_fffffffffffff868);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    in_stack_fffffffffffff868 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a0,local_c0,local_e0,0x1b,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff868);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff868);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
               in_stack_fffffffffffff8a0,
               CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898),
               (const_string *)in_stack_fffffffffffff890);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff870,(char (*) [1])in_stack_fffffffffffff868);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    local_138._vptr_lazy_ostream._4_4_ =
         TxReconciliationTracker::RegisterPeer
                   ((TxReconciliationTracker *)
                    CONCAT17(in_stack_fffffffffffff88f,in_stack_fffffffffffff888),
                    in_stack_fffffffffffff880,SUB81((ulong)in_stack_fffffffffffff878 >> 0x38,0),
                    (uint32_t)in_stack_fffffffffffff878,(uint64_t)in_stack_fffffffffffff870);
    local_138._vptr_lazy_ostream._0_4_ = 1;
    in_stack_fffffffffffff878 = "ReconciliationRegisterResult::SUCCESS";
    in_stack_fffffffffffff870 = &local_138;
    in_stack_fffffffffffff868 = "tracker.RegisterPeer(0, true, 1, salt)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ReconciliationRegisterResult,ReconciliationRegisterResult>
              (local_120,&local_138.m_empty,0x1c,2,2,
               (undefined1 *)((long)&local_138._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff868);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
               in_stack_fffffffffffff8a0,
               CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898),
               (const_string *)in_stack_fffffffffffff890);
    TxReconciliationTracker::IsPeerRegistered
              ((TxReconciliationTracker *)in_stack_fffffffffffff878,
               (NodeId)in_stack_fffffffffffff870);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff878,
               SUB81((ulong)in_stack_fffffffffffff870 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff870,(basic_cstring<const_char> *)in_stack_fffffffffffff868);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    in_stack_fffffffffffff868 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_170,local_190,local_1b0,0x1d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff868);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff868);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
               in_stack_fffffffffffff8a0,
               CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898),
               (const_string *)in_stack_fffffffffffff890);
    TxReconciliationTracker::IsPeerRegistered
              ((TxReconciliationTracker *)in_stack_fffffffffffff878,
               (NodeId)in_stack_fffffffffffff870);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff878,
               SUB81((ulong)in_stack_fffffffffffff870 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff870,(basic_cstring<const_char> *)in_stack_fffffffffffff868);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    in_stack_fffffffffffff868 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1e8,local_208,local_228,0x1e,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff868);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff868);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  TxReconciliationTracker::PreRegisterPeer
            ((TxReconciliationTracker *)in_stack_fffffffffffff878,(NodeId)in_stack_fffffffffffff870)
  ;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
               in_stack_fffffffffffff8a0,
               CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898),
               (const_string *)in_stack_fffffffffffff890);
    TxReconciliationTracker::RegisterPeer
              ((TxReconciliationTracker *)
               CONCAT17(in_stack_fffffffffffff88f,in_stack_fffffffffffff888),
               in_stack_fffffffffffff880,SUB81((ulong)in_stack_fffffffffffff878 >> 0x38,0),
               (uint32_t)in_stack_fffffffffffff878,(uint64_t)in_stack_fffffffffffff870);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff878,
               SUB81((ulong)in_stack_fffffffffffff870 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff870,(basic_cstring<const_char> *)in_stack_fffffffffffff868);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    in_stack_fffffffffffff868 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_260,local_280,local_2a0,0x20,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff868);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff868);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
               in_stack_fffffffffffff8a0,
               CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898),
               (const_string *)in_stack_fffffffffffff890);
    TxReconciliationTracker::IsPeerRegistered
              ((TxReconciliationTracker *)in_stack_fffffffffffff878,
               (NodeId)in_stack_fffffffffffff870);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff878,
               SUB81((ulong)in_stack_fffffffffffff870 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff870,(basic_cstring<const_char> *)in_stack_fffffffffffff868);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    in_stack_fffffffffffff868 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2d8,local_2f8,local_318,0x21,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff868);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff868);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
               in_stack_fffffffffffff8a0,
               CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898),
               (const_string *)in_stack_fffffffffffff890);
    TxReconciliationTracker::IsPeerRegistered
              ((TxReconciliationTracker *)in_stack_fffffffffffff878,
               (NodeId)in_stack_fffffffffffff870);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff878,
               SUB81((ulong)in_stack_fffffffffffff870 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff870,(basic_cstring<const_char> *)in_stack_fffffffffffff868);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    in_stack_fffffffffffff868 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_350,local_370,local_390,0x24,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff868);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff868);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  TxReconciliationTracker::PreRegisterPeer
            ((TxReconciliationTracker *)in_stack_fffffffffffff878,(NodeId)in_stack_fffffffffffff870)
  ;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
               in_stack_fffffffffffff8a0,
               CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898),
               (const_string *)in_stack_fffffffffffff890);
    TxReconciliationTracker::RegisterPeer
              ((TxReconciliationTracker *)
               CONCAT17(in_stack_fffffffffffff88f,in_stack_fffffffffffff888),
               in_stack_fffffffffffff880,SUB81((ulong)in_stack_fffffffffffff878 >> 0x38,0),
               (uint32_t)in_stack_fffffffffffff878,(uint64_t)in_stack_fffffffffffff870);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff878,
               SUB81((ulong)in_stack_fffffffffffff870 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff870,(basic_cstring<const_char> *)in_stack_fffffffffffff868);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    in_stack_fffffffffffff868 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3c8,local_3e8,local_408,0x26,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff868);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff868);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
               in_stack_fffffffffffff8a0,
               CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898),
               (const_string *)in_stack_fffffffffffff890);
    TxReconciliationTracker::IsPeerRegistered
              ((TxReconciliationTracker *)in_stack_fffffffffffff878,
               (NodeId)in_stack_fffffffffffff870);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff878,
               SUB81((ulong)in_stack_fffffffffffff870 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff870,(basic_cstring<const_char> *)in_stack_fffffffffffff868);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    in_stack_fffffffffffff868 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_440,local_460,local_480,0x27,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff868);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff868);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
               in_stack_fffffffffffff8a0,
               CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898),
               (const_string *)in_stack_fffffffffffff890);
    TxReconciliationTracker::RegisterPeer
              ((TxReconciliationTracker *)
               CONCAT17(in_stack_fffffffffffff88f,in_stack_fffffffffffff888),
               in_stack_fffffffffffff880,SUB81((ulong)in_stack_fffffffffffff878 >> 0x38,0),
               (uint32_t)in_stack_fffffffffffff878,(uint64_t)in_stack_fffffffffffff870);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff878,
               SUB81((ulong)in_stack_fffffffffffff870 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff870,(basic_cstring<const_char> *)in_stack_fffffffffffff868);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    in_stack_fffffffffffff868 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4b8,local_4d8,local_4f8,0x2a,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff868);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff868);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
               in_stack_fffffffffffff8a0,
               CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898),
               (const_string *)in_stack_fffffffffffff890);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff870,(char (*) [1])in_stack_fffffffffffff868);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    in_stack_fffffffffffff8ac =
         TxReconciliationTracker::RegisterPeer
                   ((TxReconciliationTracker *)
                    CONCAT17(in_stack_fffffffffffff88f,in_stack_fffffffffffff888),
                    in_stack_fffffffffffff880,SUB81((ulong)in_stack_fffffffffffff878 >> 0x38,0),
                    (uint32_t)in_stack_fffffffffffff878,(uint64_t)in_stack_fffffffffffff870);
    local_550._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffff878 = "ReconciliationRegisterResult::NOT_FOUND";
    in_stack_fffffffffffff870 = &local_550;
    in_stack_fffffffffffff868 = "tracker.RegisterPeer(100, true, 1, salt)";
    local_550._vptr_lazy_ostream._4_4_ = in_stack_fffffffffffff8ac;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ReconciliationRegisterResult,ReconciliationRegisterResult>
              (local_538,&local_550.m_empty,0x2d,2,2,
               (undefined1 *)((long)&local_550._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff868);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
    in_stack_fffffffffffff8a8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff8a8);
  } while (bVar1);
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),file
               ,CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898),
               (const_string *)in_stack_fffffffffffff890);
    in_stack_fffffffffffff89f =
         TxReconciliationTracker::IsPeerRegistered
                   ((TxReconciliationTracker *)in_stack_fffffffffffff878,
                    (NodeId)in_stack_fffffffffffff870);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff878,
               SUB81((ulong)in_stack_fffffffffffff870 >> 0x38,0));
    in_stack_fffffffffffff890 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff870,(basic_cstring<const_char> *)in_stack_fffffffffffff868);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878,
               (pointer)in_stack_fffffffffffff870,(unsigned_long)in_stack_fffffffffffff868);
    in_stack_fffffffffffff868 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_588,local_5a8,local_5c8,0x2e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff868);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff868);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  TxReconciliationTracker::~TxReconciliationTracker
            ((TxReconciliationTracker *)in_stack_fffffffffffff868);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(RegisterPeerTest)
{
    TxReconciliationTracker tracker(TXRECONCILIATION_VERSION);
    const uint64_t salt = 0;

    // Prepare a peer for reconciliation.
    tracker.PreRegisterPeer(0);

    // Invalid version.
    BOOST_CHECK_EQUAL(tracker.RegisterPeer(/*peer_id=*/0, /*is_peer_inbound=*/true,
                                           /*peer_recon_version=*/0, salt),
                      ReconciliationRegisterResult::PROTOCOL_VIOLATION);

    // Valid registration (inbound and outbound peers).
    BOOST_REQUIRE(!tracker.IsPeerRegistered(0));
    BOOST_REQUIRE_EQUAL(tracker.RegisterPeer(0, true, 1, salt), ReconciliationRegisterResult::SUCCESS);
    BOOST_CHECK(tracker.IsPeerRegistered(0));
    BOOST_REQUIRE(!tracker.IsPeerRegistered(1));
    tracker.PreRegisterPeer(1);
    BOOST_REQUIRE(tracker.RegisterPeer(1, false, 1, salt) == ReconciliationRegisterResult::SUCCESS);
    BOOST_CHECK(tracker.IsPeerRegistered(1));

    // Reconciliation version is higher than ours, should be able to register.
    BOOST_REQUIRE(!tracker.IsPeerRegistered(2));
    tracker.PreRegisterPeer(2);
    BOOST_REQUIRE(tracker.RegisterPeer(2, true, 2, salt) == ReconciliationRegisterResult::SUCCESS);
    BOOST_CHECK(tracker.IsPeerRegistered(2));

    // Try registering for the second time.
    BOOST_REQUIRE(tracker.RegisterPeer(1, false, 1, salt) == ReconciliationRegisterResult::ALREADY_REGISTERED);

    // Do not register if there were no pre-registration for the peer.
    BOOST_REQUIRE_EQUAL(tracker.RegisterPeer(100, true, 1, salt), ReconciliationRegisterResult::NOT_FOUND);
    BOOST_CHECK(!tracker.IsPeerRegistered(100));
}